

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropymode.c
# Opt level: O0

int av1_get_palette_color_index_context
              (uint8_t *color_map,int stride,int r,int c,int palette_size,uint8_t *color_order,
              int *color_idx)

{
  undefined1 uVar1;
  int iVar2;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  long in_R9;
  int *in_stack_00000008;
  int color_index_ctx;
  int color_index_ctx_hash;
  int k;
  uint8_t max_color_order;
  int max_score;
  int j;
  int max_idx;
  int max;
  int inverse_color_order [8];
  int i;
  int scores [18];
  int color_neighbors [3];
  uint local_d4;
  uint local_d0;
  uint local_cc;
  int local_c4;
  int local_c0;
  int local_b4;
  int local_b0;
  int local_ac;
  int aiStack_a8 [11];
  int local_7c;
  int local_78 [19];
  uint local_2c [3];
  long local_20;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  long local_8;
  
  if (in_ECX + -1 < 0) {
    local_cc = 0xffffffff;
  }
  else {
    local_cc = (uint)*(byte *)(in_RDI + (in_EDX * in_ESI + in_ECX + -1));
  }
  local_2c[0] = local_cc;
  if ((in_ECX + -1 < 0) || (in_EDX + -1 < 0)) {
    local_d0 = 0xffffffff;
  }
  else {
    local_d0 = (uint)*(byte *)(in_RDI + ((in_EDX + -1) * in_ESI + in_ECX + -1));
  }
  local_2c[1] = local_d0;
  if (in_EDX + -1 < 0) {
    local_d4 = 0xffffffff;
  }
  else {
    local_d4 = (uint)*(byte *)(in_RDI + ((in_EDX + -1) * in_ESI + in_ECX));
  }
  local_2c[2] = local_d4;
  local_20 = in_R9;
  local_18 = in_R8D;
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  memset(local_78,0,0x48);
  for (local_7c = 0; local_7c < 3; local_7c = local_7c + 1) {
    if (-1 < (int)local_2c[local_7c]) {
      local_78[(int)local_2c[local_7c]] =
           av1_get_palette_color_index_context::weights[local_7c] +
           local_78[(int)local_2c[local_7c]];
    }
  }
  for (local_7c = 0; local_7c < 8; local_7c = local_7c + 1) {
    *(char *)(local_20 + local_7c) = (char)local_7c;
    aiStack_a8[local_7c] = local_7c;
  }
  for (local_7c = 0; local_7c < 3; local_7c = local_7c + 1) {
    local_ac = local_78[local_7c];
    local_b0 = local_7c;
    local_b4 = local_7c;
    while (local_b4 = local_b4 + 1, local_b4 < local_18) {
      if (local_ac < local_78[local_b4]) {
        local_ac = local_78[local_b4];
        local_b0 = local_b4;
      }
    }
    if (local_b0 != local_7c) {
      iVar2 = local_78[local_b0];
      uVar1 = *(undefined1 *)(local_20 + local_b0);
      for (local_c0 = local_b0; local_7c < local_c0; local_c0 = local_c0 + -1) {
        local_78[local_c0] = local_78[local_c0 + -1];
        *(undefined1 *)(local_20 + local_c0) = *(undefined1 *)(local_20 + (local_c0 + -1));
        aiStack_a8[*(byte *)(local_20 + local_c0)] = local_c0;
      }
      local_78[local_7c] = iVar2;
      *(undefined1 *)(local_20 + local_7c) = uVar1;
      aiStack_a8[*(byte *)(local_20 + local_7c)] = local_7c;
    }
  }
  if (in_stack_00000008 != (int *)0x0) {
    *in_stack_00000008 = aiStack_a8[*(byte *)(local_8 + (local_10 * local_c + local_14))];
  }
  local_c4 = 0;
  for (local_7c = 0; local_7c < 3; local_7c = local_7c + 1) {
    local_c4 = local_78[local_7c] * av1_get_palette_color_index_context::hash_multipliers[local_7c]
               + local_c4;
  }
  return av1_palette_color_index_context_lookup[local_c4];
}

Assistant:

int av1_get_palette_color_index_context(const uint8_t *color_map, int stride,
                                        int r, int c, int palette_size,
                                        uint8_t *color_order, int *color_idx) {
  assert(palette_size <= PALETTE_MAX_SIZE);
  assert(r > 0 || c > 0);

  // Get color indices of neighbors.
  int color_neighbors[NUM_PALETTE_NEIGHBORS];
  color_neighbors[0] = (c - 1 >= 0) ? color_map[r * stride + c - 1] : -1;
  color_neighbors[1] =
      (c - 1 >= 0 && r - 1 >= 0) ? color_map[(r - 1) * stride + c - 1] : -1;
  color_neighbors[2] = (r - 1 >= 0) ? color_map[(r - 1) * stride + c] : -1;

  // The +10 below should not be needed. But we get a warning "array subscript
  // is above array bounds [-Werror=array-bounds]" without it, possibly due to
  // this (or similar) bug: https://gcc.gnu.org/bugzilla/show_bug.cgi?id=59124
  int scores[PALETTE_MAX_SIZE + 10] = { 0 };
  int i;
  static const int weights[NUM_PALETTE_NEIGHBORS] = { 2, 1, 2 };
  for (i = 0; i < NUM_PALETTE_NEIGHBORS; ++i) {
    if (color_neighbors[i] >= 0) {
      scores[color_neighbors[i]] += weights[i];
    }
  }

  int inverse_color_order[PALETTE_MAX_SIZE];
  for (i = 0; i < PALETTE_MAX_SIZE; ++i) {
    color_order[i] = i;
    inverse_color_order[i] = i;
  }

  // Get the top NUM_PALETTE_NEIGHBORS scores (sorted from large to small).
  for (i = 0; i < NUM_PALETTE_NEIGHBORS; ++i) {
    int max = scores[i];
    int max_idx = i;
    for (int j = i + 1; j < palette_size; ++j) {
      if (scores[j] > max) {
        max = scores[j];
        max_idx = j;
      }
    }
    if (max_idx != i) {
      // Move the score at index 'max_idx' to index 'i', and shift the scores
      // from 'i' to 'max_idx - 1' by 1.
      const int max_score = scores[max_idx];
      const uint8_t max_color_order = color_order[max_idx];
      for (int k = max_idx; k > i; --k) {
        scores[k] = scores[k - 1];
        color_order[k] = color_order[k - 1];
        inverse_color_order[color_order[k]] = k;
      }
      scores[i] = max_score;
      color_order[i] = max_color_order;
      inverse_color_order[color_order[i]] = i;
    }
  }

  if (color_idx != NULL)
    *color_idx = inverse_color_order[color_map[r * stride + c]];

  // Get hash value of context.
  int color_index_ctx_hash = 0;
  static const int hash_multipliers[NUM_PALETTE_NEIGHBORS] = { 1, 2, 2 };
  for (i = 0; i < NUM_PALETTE_NEIGHBORS; ++i) {
    color_index_ctx_hash += scores[i] * hash_multipliers[i];
  }
  assert(color_index_ctx_hash > 0);
  assert(color_index_ctx_hash <= MAX_COLOR_CONTEXT_HASH);

  // Lookup context from hash.
  const int color_index_ctx =
      av1_palette_color_index_context_lookup[color_index_ctx_hash];
  assert(color_index_ctx >= 0);
  assert(color_index_ctx < PALETTE_COLOR_INDEX_CONTEXTS);
  return color_index_ctx;
}